

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::RecyclableArgumentsArrayWalker::FetchFormalsAddress
          (RecyclableArgumentsArrayWalker *this,LocalsWalker *localsWalker)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  undefined4 extraout_var;
  FunctionBody *this_00;
  void *pvVar5;
  uint *puVar6;
  IDiagObjectAddress *pIVar7;
  ArenaAllocator *alloc;
  List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar8;
  ulong uVar9;
  bool local_31 [8];
  bool isConst;
  
  if (localsWalker == (LocalsWalker *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc38,"(localsWalker)","localsWalker");
    if (!bVar2) goto LAB_008c63cc;
    *puVar4 = 0;
  }
  if (localsWalker->pFrame == (DiagStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc39,"(localsWalker->pFrame)","localsWalker->pFrame");
    if (!bVar2) goto LAB_008c63cc;
    *puVar4 = 0;
  }
  iVar3 = (*localsWalker->pFrame->_vptr_DiagStackFrame[2])();
  this_00 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xc3b,"(pFBody)","pFBody");
    if (!bVar2) {
LAB_008c63cc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_00,PropertyIdOnRegSlotsContainer);
  if (((pvVar5 != (void *)0x0) && (*(long *)((long)pvVar5 + 0x10) != 0)) &&
     (puVar6 = *(uint **)((long)pvVar5 + 0x10), *puVar6 != 0)) {
    uVar9 = 0;
    do {
      if (puVar6[uVar9 + 2] != 0xffffffff) {
        local_31[0] = false;
        pIVar7 = LocalsWalker::FindPropertyAddress(localsWalker,puVar6[uVar9 + 2],false,local_31);
        if (pIVar7 != (IDiagObjectAddress *)0x0) {
          if (this->pFormalsList ==
              (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)0x0) {
            alloc = GetArenaFromContext((this->super_RecyclableArrayWalker).
                                        super_RecyclableObjectWalker.scriptContext);
            pLVar8 = (List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
            (pLVar8->
            super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).
            buffer = (Type)0x0;
            (pLVar8->
            super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count = 0;
            (pLVar8->
            super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).
            alloc = alloc;
            (pLVar8->
            super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).
            _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014fa3b8;
            pLVar8->length = 0;
            pLVar8->increment = 4;
            this->pFormalsList = pLVar8;
          }
          pLVar8 = this->pFormalsList;
          JsUtil::
          List<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          ::EnsureArray(pLVar8,0);
          iVar3 = (pLVar8->
                  super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>
                  ).count;
          (pLVar8->
          super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).
          buffer[iVar3] = pIVar7;
          (pLVar8->
          super_ReadOnlyList<Js::IDiagObjectAddress_*,_Memory::ArenaAllocator,_DefaultComparer>).
          count = iVar3 + 1;
        }
      }
      uVar9 = uVar9 + 1;
      puVar6 = *(uint **)((long)pvVar5 + 0x10);
    } while (uVar9 < *puVar6);
  }
  return;
}

Assistant:

void RecyclableArgumentsArrayWalker::FetchFormalsAddress(LocalsWalker * localsWalker)
    {
        Assert(localsWalker);
        Assert(localsWalker->pFrame);
        Js::FunctionBody *pFBody = localsWalker->pFrame->GetJavascriptFunction()->GetFunctionBody();
        Assert(pFBody);

        PropertyIdOnRegSlotsContainer * container = pFBody->GetPropertyIdOnRegSlotsContainer();
        if (container &&  container->propertyIdsForFormalArgs)
        {
            for (uint32 i = 0; i < container->propertyIdsForFormalArgs->count; i++)
            {
                if (container->propertyIdsForFormalArgs->elements[i] != Js::Constants::NoRegister)
                {
                    bool isConst = false;
                    IDiagObjectAddress * address = localsWalker->FindPropertyAddress(container->propertyIdsForFormalArgs->elements[i], false, isConst);
                    if (address)
                    {
                        if (pFormalsList == nullptr)
                        {
                            pFormalsList = JsUtil::List<IDiagObjectAddress *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
                        }

                        pFormalsList->Add(address);
                    }
                }
            }
        }
    }